

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O3

IVec2 __thiscall
deqp::gles31::Functional::anon_unknown_1::LineRenderCase::getNumberOfLinesRange
          (LineRenderCase *this,int queryAreaBegin,int queryAreaEnd,float patternStart,
          float patternSize,int viewportArea,QueryDirection queryDir)

{
  int iVar1;
  IVec2 IVar2;
  uint uVar3;
  undefined4 in_register_00000034;
  int in_R9D;
  uint uVar4;
  int lineNdx;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  float fVar22;
  float fVar23;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar24;
  float fVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  
  uVar34 = (uint)*(byte *)(CONCAT44(in_register_00000034,queryAreaBegin) + 0x80 +
                          (ulong)(in_R9D == 0));
  iVar1 = *(int *)(CONCAT44(in_register_00000034,queryAreaBegin) + 0xd4);
  iVar5 = 0;
  IVar2.m_data[0] = 0;
  IVar2.m_data[1] = 0;
  if ((int)uVar34 < (int)(iVar1 + uVar34)) {
    fVar6 = 1.0;
    if (*(char *)(CONCAT44(in_register_00000034,queryAreaBegin) + 0xd8) != '\0') {
      fVar6 = (float)*(int *)(CONCAT44(in_register_00000034,queryAreaBegin) + 0xdc);
    }
    fVar25 = fVar6 * 0.5 + (float)viewportArea + 1.0;
    fVar18 = ((float)queryAreaEnd - fVar6 * 0.5) + -1.0;
    fVar7 = (float)viewportArea + -1.0;
    fVar8 = (float)(int)queryDir;
    fVar6 = (float)queryAreaEnd + 1.0;
    fVar9 = (float)iVar1;
    uVar4 = iVar1 - 1;
    uVar35 = uVar34 + 1;
    uVar36 = uVar34 + 2;
    uVar37 = uVar34 + 3;
    uVar3 = 0;
    uVar11 = 0;
    uVar13 = 0;
    uVar15 = 0;
    uVar17 = 0;
    uVar27 = 0;
    uVar29 = 0;
    uVar31 = 0;
    uVar33 = 0;
    do {
      uVar32 = uVar33;
      uVar30 = uVar31;
      uVar28 = uVar29;
      uVar26 = uVar27;
      uVar16 = uVar17;
      uVar14 = uVar15;
      uVar12 = uVar13;
      uVar10 = uVar11;
      auVar20._0_4_ =
           ((float)(uVar34 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar34 & 0xffff | 0x4b000000);
      auVar20._4_4_ =
           ((float)(uVar35 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar35 & 0xffff | 0x4b000000);
      auVar20._8_4_ =
           ((float)(uVar36 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar36 & 0xffff | 0x4b000000);
      auVar20._12_4_ =
           ((float)(uVar37 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar37 & 0xffff | 0x4b000000);
      auVar21._4_4_ = fVar9;
      auVar21._0_4_ = fVar9;
      auVar21._8_4_ = fVar9;
      auVar21._12_4_ = fVar9;
      auVar21 = divps(auVar20,auVar21);
      uVar38 = -(uint)((int)(uVar4 ^ 0x80000000) < (int)(uVar3 ^ 0x80000000));
      uVar39 = -(uint)((int)(uVar4 ^ 0x80000000) < (int)((uVar3 | 1) ^ 0x80000000));
      uVar40 = -(uint)((int)(uVar4 ^ 0x80000000) < (int)((uVar3 | 2) ^ 0x80000000));
      uVar41 = -(uint)((int)(uVar4 ^ 0x80000000) < (int)((uVar3 | 3) ^ 0x80000000));
      fVar19 = ((auVar21._0_4_ * patternSize + patternStart) * 0.5 + 0.5) * fVar8;
      fVar22 = ((auVar21._4_4_ * patternSize + patternStart) * 0.5 + 0.5) * fVar8;
      fVar23 = ((auVar21._8_4_ * patternSize + patternStart) * 0.5 + 0.5) * fVar8;
      fVar24 = ((auVar21._12_4_ * patternSize + patternStart) * 0.5 + 0.5) * fVar8;
      uVar11 = ~uVar38 & -(uint)(fVar6 < fVar19 && fVar19 < fVar7);
      uVar13 = ~uVar39 & -(uint)(fVar6 < fVar22 && fVar22 < fVar7);
      uVar15 = ~uVar40 & -(uint)(fVar6 < fVar23 && fVar23 < fVar7);
      uVar17 = ~uVar41 & -(uint)(fVar6 < fVar24 && fVar24 < fVar7);
      uVar27 = uVar26 - uVar11;
      uVar29 = uVar28 - uVar13;
      uVar31 = uVar30 - uVar15;
      uVar33 = uVar32 - uVar17;
      uVar11 = uVar10 - (-(uint)(fVar18 < fVar19 && fVar19 < fVar25) | uVar11);
      uVar13 = uVar12 - (-(uint)(fVar18 < fVar22 && fVar22 < fVar25) | uVar13);
      uVar15 = uVar14 - (-(uint)(fVar18 < fVar23 && fVar23 < fVar25) | uVar15);
      uVar17 = uVar16 - (-(uint)(fVar18 < fVar24 && fVar24 < fVar25) | uVar17);
      uVar3 = uVar3 + 4;
      uVar34 = uVar34 + 4;
      uVar35 = uVar35 + 4;
      uVar36 = uVar36 + 4;
      uVar37 = uVar37 + 4;
    } while ((iVar1 + 3U & 0xfffffffc) != uVar3);
    IVar2.m_data[1] = 0;
    IVar2.m_data[0] =
         (~uVar41 & uVar33 | uVar32 & uVar41) + (~uVar39 & uVar29 | uVar28 & uVar39) +
         (~uVar40 & uVar31 | uVar30 & uVar40) + (~uVar38 & uVar27 | uVar26 & uVar38);
    iVar5 = (~uVar41 & uVar17 | uVar16 & uVar41) + (~uVar39 & uVar13 | uVar12 & uVar39) +
            (~uVar40 & uVar15 | uVar14 & uVar40) + (~uVar38 & uVar11 | uVar10 & uVar38);
  }
  *(int *)&(this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
       = IVar2.m_data[0];
  *(int *)((long)&(this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.
                  _vptr_TestNode + 4) = iVar5;
  return (IVec2)IVar2.m_data;
}

Assistant:

tcu::IVec2 LineRenderCase::getNumberOfLinesRange (int queryAreaBegin, int queryAreaEnd, float patternStart, float patternSize, int viewportArea, QueryDirection queryDir) const
{
	// pattern is not symmetric due to mirroring
	const int	patternStartNdx	= (queryDir == DIRECTION_HORIZONTAL) ? ((m_hasGeometryStage) ? (1) : (0)) : ((m_hasTessellationStage) ? (1) : (0));
	const int	patternEndNdx	= patternStartNdx + m_patternSide;

	int			numLinesMin		= 0;
	int			numLinesMax		= 0;

	for (int lineNdx = patternStartNdx; lineNdx < patternEndNdx; ++lineNdx)
	{
		const float linePos		= (patternStart + (float(lineNdx) / float(m_patternSide)) * patternSize) * 0.5f + 0.5f;
		const float lineWidth	= (m_isWideLineCase) ? ((float)m_wideLineLineWidth) : (1.0f);

		if (linePos * (float)viewportArea > (float)queryAreaBegin + 1.0f &&
			linePos * (float)viewportArea < (float)queryAreaEnd   - 1.0f)
		{
			// line center is within the area
			++numLinesMin;
			++numLinesMax;
		}
		else if (linePos * (float)viewportArea > (float)queryAreaBegin - lineWidth*0.5f - 1.0f &&
		         linePos * (float)viewportArea < (float)queryAreaEnd   + lineWidth*0.5f + 1.0f)
		{
			// line could leak into area
			++numLinesMax;
		}
	}

	return tcu::IVec2(numLinesMin, numLinesMax);
}